

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hold_ptr.h
# Opt level: O2

void __thiscall
booster::hold_ptr<cppcms::application::_data>::~hold_ptr(hold_ptr<cppcms::application::_data> *this)

{
  _data *this_00;
  
  this_00 = this->ptr_;
  if (this_00 != (_data *)0x0) {
    cppcms::application::_data::~_data(this_00);
    operator_delete(this_00);
    return;
  }
  return;
}

Assistant:

~hold_ptr() 
		{
			if(ptr_) delete ptr_;
		}